

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiAnalyzer.cpp
# Opt level: O0

bool __thiscall
SpiAnalyzer::WouldAdvancingTheClockToggleEnable
          (SpiAnalyzer *this,bool add_disable_frame,U64 *disable_frame)

{
  byte bVar1;
  BitState BVar2;
  ulong uVar3;
  element_type *peVar4;
  U64 UVar5;
  U64 enable_edge;
  bool enable_will_toggle;
  U64 next_edge;
  U64 next_enable_edge;
  anon_class_24_3_692f4939 log_disable_event;
  U64 *disable_frame_local;
  SpiAnalyzer *pSStack_18;
  bool add_disable_frame_local;
  SpiAnalyzer *this_local;
  
  if (this->mEnable == (AnalyzerChannelData *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    next_enable_edge = (long)&disable_frame_local + 7;
    log_disable_event.this = (SpiAnalyzer *)&log_disable_event.disable_frame;
    log_disable_event.add_disable_frame = (bool *)this;
    log_disable_event.disable_frame = (U64 **)disable_frame;
    disable_frame_local._7_1_ = add_disable_frame;
    pSStack_18 = this;
    uVar3 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
    if ((uVar3 & 1) == 0) {
      BVar2 = AnalyzerChannelData::GetBitState();
      peVar4 = std::auto_ptr<SpiAnalyzerSettings>::operator->(&this->mSettings);
      if ((BVar2 == peVar4->mEnableActiveState) &&
         (uVar3 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData(), (uVar3 & 1) != 0)) {
        UVar5 = AnalyzerChannelData::GetSampleOfNextEdge();
        uVar3 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition
                          ((ulonglong)this->mClock);
        if ((uVar3 & 1) == 0) {
          WouldAdvancingTheClockToggleEnable::anon_class_24_3_692f4939::operator()
                    ((anon_class_24_3_692f4939 *)&next_enable_edge,UVar5);
          return true;
        }
      }
    }
    AnalyzerChannelData::GetSampleOfNextEdge();
    bVar1 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition
                      ((ulonglong)this->mEnable);
    if ((bVar1 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      UVar5 = AnalyzerChannelData::GetSampleOfNextEdge();
      WouldAdvancingTheClockToggleEnable::anon_class_24_3_692f4939::operator()
                ((anon_class_24_3_692f4939 *)&next_enable_edge,UVar5);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SpiAnalyzer::WouldAdvancingTheClockToggleEnable( bool add_disable_frame, U64* disable_frame )
{
    if( mEnable == NULL )
        return false;

    auto log_disable_event = [&]( U64 enable_edge ) {
        if( add_disable_frame )
        {
            FrameV2 frame_v2_end_of_transaction;
            mResults->AddFrameV2( frame_v2_end_of_transaction, "disable", enable_edge, enable_edge + 1 );
        }
        else if( disable_frame != nullptr )
        {
            *disable_frame = enable_edge;
        }
    };

    // if the enable is currently active, and there are no more clock transitions in the capture, attempt to capture the final disable event
    if( !mClock->DoMoreTransitionsExistInCurrentData() && mEnable->GetBitState() == mSettings->mEnableActiveState )
    {
        if( mEnable->DoMoreTransitionsExistInCurrentData() )
        {
            U64 next_enable_edge = mEnable->GetSampleOfNextEdge();
            // double check that the clock line actually processed all samples up to the next enable edge.
            // double check is required becase data is getting processed while we're running, it's possible more has already become
            // available.
            if( !mClock->WouldAdvancingToAbsPositionCauseTransition( next_enable_edge ) )
            {
                log_disable_event( next_enable_edge );
                return true;
            }
        }
    }

    U64 next_edge = mClock->GetSampleOfNextEdge();
    bool enable_will_toggle = mEnable->WouldAdvancingToAbsPositionCauseTransition( next_edge );

    if( enable_will_toggle )
    {
        U64 enable_edge = mEnable->GetSampleOfNextEdge();
        log_disable_event( enable_edge );
    }

    if( enable_will_toggle == false )
        return false;
    else
        return true;
}